

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O3

void __thiscall LargeGapGrayCode::printStatistics(LargeGapGrayCode *this,int bitWidth)

{
  int iVar1;
  LargeGapGrayCode *pLVar2;
  ostream *poVar3;
  long *plVar4;
  const_iterator it;
  int iVar5;
  int unaff_R14D;
  int iVar6;
  double dVar7;
  undefined1 local_78 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> runLengths;
  int local_34;
  
  pLVar2 = (LargeGapGrayCode *)local_78;
  runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  computeRunLengths((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    pLVar2,this,bitWidth);
  if ((LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (LargeGapGrayCode *)&runLengths) {
    iVar5 = 0;
    iVar6 = 999;
  }
  else {
    iVar6 = 999;
    pLVar2 = (LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_34 = unaff_R14D;
    do {
      iVar5 = *(int *)&(pLVar2->m_creationMethod).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (iVar5 < iVar6) {
        local_34 = *(int *)((long)&(pLVar2->m_creationMethod).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4);
        iVar6 = iVar5;
      }
      pLVar2 = (LargeGapGrayCode *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar2);
    } while (pLVar2 != (LargeGapGrayCode *)&runLengths);
    iVar5 = 0;
    unaff_R14D = local_34;
    do {
      pLVar2 = (LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      iVar1 = *(int *)&(pLVar2->m_creationMethod).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (iVar5 < iVar1) {
        unaff_R14D = *(int *)((long)&(pLVar2->m_creationMethod).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 4);
        iVar5 = iVar1;
      }
      runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar2);
    } while ((LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
             != (LargeGapGrayCode *)&runLengths);
  }
  dVar7 = computeGapVariance(pLVar2,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                     *)local_78);
  *(undefined8 *)(std::__cxx11::string::_M_create + *(long *)(std::cout + -0x18)) = 5;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bitWidth);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)(*(long *)(runLengths._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count + 0x20) + -0x20 +
                                       (long)bitWidth * 0x20),
                      *(long *)(*(long *)(runLengths._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 0x20) + -0x18 + (long)bitWidth * 0x20));
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  plVar4 = (long *)std::ostream::operator<<(poVar3,unaff_R14D);
  *(undefined8 *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x10) = 0xe;
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_78);
  return;
}

Assistant:

void LargeGapGrayCode::printStatistics(int bitWidth)
{
	std::map<int, int> runLengths = computeRunLengths(bitWidth);
	int minGap, minCount, maxGap, maxCount;
	computeMinGap(runLengths, minGap, minCount);
	computeMaxGap(runLengths, maxGap, maxCount);
	double gapVariance = computeGapVariance(runLengths);
	std::cout 	<< std::setw(5) << bitWidth
			<< std::setw(12) << m_creationMethod[bitWidth-1]
			<< std::setw(12) << minGap
			<< std::setw(12) << maxGap
			<< std::setw(12) << minCount
			<< std::setw(12) << maxCount
			<< std::setw(14) << gapVariance << std::endl;
}